

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_pubkey_parse
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *input,size_t inputlen)

{
  secp256k1_fe *r;
  byte bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  secp256k1_ge local_388;
  secp256k1_fe x3_1;
  secp256k1_fe x6;
  secp256k1_fe local_2d8;
  secp256k1_fe x44;
  secp256k1_fe x22;
  secp256k1_fe x2_1;
  secp256k1_fe local_228;
  secp256k1_fe x88;
  secp256k1_fe x11;
  secp256k1_fe x223;
  secp256k1_fe x220;
  secp256k1_fe x176;
  secp256k1_fe x9;
  secp256k1_fe y2;
  secp256k1_fe x;
  secp256k1_fe x3;
  secp256k1_fe x2;
  
  pubkey->data[0x30] = '\0';
  pubkey->data[0x31] = '\0';
  pubkey->data[0x32] = '\0';
  pubkey->data[0x33] = '\0';
  pubkey->data[0x34] = '\0';
  pubkey->data[0x35] = '\0';
  pubkey->data[0x36] = '\0';
  pubkey->data[0x37] = '\0';
  pubkey->data[0x38] = '\0';
  pubkey->data[0x39] = '\0';
  pubkey->data[0x3a] = '\0';
  pubkey->data[0x3b] = '\0';
  pubkey->data[0x3c] = '\0';
  pubkey->data[0x3d] = '\0';
  pubkey->data[0x3e] = '\0';
  pubkey->data[0x3f] = '\0';
  pubkey->data[0x20] = '\0';
  pubkey->data[0x21] = '\0';
  pubkey->data[0x22] = '\0';
  pubkey->data[0x23] = '\0';
  pubkey->data[0x24] = '\0';
  pubkey->data[0x25] = '\0';
  pubkey->data[0x26] = '\0';
  pubkey->data[0x27] = '\0';
  pubkey->data[0x28] = '\0';
  pubkey->data[0x29] = '\0';
  pubkey->data[0x2a] = '\0';
  pubkey->data[0x2b] = '\0';
  pubkey->data[0x2c] = '\0';
  pubkey->data[0x2d] = '\0';
  pubkey->data[0x2e] = '\0';
  pubkey->data[0x2f] = '\0';
  pubkey->data[0x10] = '\0';
  pubkey->data[0x11] = '\0';
  pubkey->data[0x12] = '\0';
  pubkey->data[0x13] = '\0';
  pubkey->data[0x14] = '\0';
  pubkey->data[0x15] = '\0';
  pubkey->data[0x16] = '\0';
  pubkey->data[0x17] = '\0';
  pubkey->data[0x18] = '\0';
  pubkey->data[0x19] = '\0';
  pubkey->data[0x1a] = '\0';
  pubkey->data[0x1b] = '\0';
  pubkey->data[0x1c] = '\0';
  pubkey->data[0x1d] = '\0';
  pubkey->data[0x1e] = '\0';
  pubkey->data[0x1f] = '\0';
  pubkey->data[0] = '\0';
  pubkey->data[1] = '\0';
  pubkey->data[2] = '\0';
  pubkey->data[3] = '\0';
  pubkey->data[4] = '\0';
  pubkey->data[5] = '\0';
  pubkey->data[6] = '\0';
  pubkey->data[7] = '\0';
  pubkey->data[8] = '\0';
  pubkey->data[9] = '\0';
  pubkey->data[10] = '\0';
  pubkey->data[0xb] = '\0';
  pubkey->data[0xc] = '\0';
  pubkey->data[0xd] = '\0';
  pubkey->data[0xe] = '\0';
  pubkey->data[0xf] = '\0';
  if (inputlen == 0x41) {
    bVar1 = *input;
    if (7 < bVar1) {
      return 0;
    }
    if ((0xd0U >> (bVar1 & 0x1f) & 1) == 0) {
      return 0;
    }
    iVar2 = secp256k1_fe_set_b32(&x3_1,input + 1);
    iVar3 = 0;
    if ((iVar2 != 0) && (iVar2 = secp256k1_fe_set_b32(&x6,input + 0x21), iVar2 != 0)) {
      local_388.infinity = 0;
      local_388.x.n[0] = x3_1.n[0];
      local_388.x.n[1] = x3_1.n[1];
      local_388.x.n[2] = x3_1.n[2];
      local_388.x.n[3] = x3_1.n[3];
      local_388.x.n[4] = x3_1.n[4];
      local_388.y.n[0] = x6.n[0];
      local_388.y.n[1] = x6.n[1];
      local_388.y.n[2] = x6.n[2];
      local_388.y.n[3] = x6.n[3];
      local_388.y.n[4] = x6.n[4];
      if (((bVar1 & 0xfe) != 6) || ((bVar1 != 7) != (bool)((byte)x6.n[0] & 1))) {
        secp256k1_fe_sqr(&y2,&local_388.y);
        secp256k1_fe_sqr(&x2_1,&local_388.x);
        secp256k1_fe_mul(&x2_1,&x2_1,&local_388.x);
        x2_1.n[0] = x2_1.n[0] + 7;
        secp256k1_fe_normalize_weak(&x2_1);
        iVar3 = secp256k1_fe_equal_var(&y2,&x2_1);
      }
    }
  }
  else {
    if (inputlen != 0x21) {
      return 0;
    }
    bVar1 = *input;
    if ((bVar1 & 0xfe) != 2) {
      return 0;
    }
    iVar2 = secp256k1_fe_set_b32(&x,input + 1);
    iVar3 = 0;
    if (iVar2 != 0) {
      local_388.x.n[0] = x.n[0];
      local_388.x.n[1] = x.n[1];
      local_388.x.n[2] = x.n[2];
      local_388.x.n[3] = x.n[3];
      local_388.x.n[4] = x.n[4];
      secp256k1_fe_sqr(&x2,&x);
      secp256k1_fe_mul(&x3,&x,&x2);
      local_388.infinity = 0;
      local_2d8.n[0] = x3.n[0] + 7;
      local_2d8.n[1] = x3.n[1];
      local_2d8.n[2] = x3.n[2];
      local_2d8.n[3] = x3.n[3];
      local_2d8.n[4] = x3.n[4];
      secp256k1_fe_sqr(&x2_1,&local_2d8);
      secp256k1_fe_mul(&x2_1,&x2_1,&local_2d8);
      secp256k1_fe_sqr(&x3_1,&x2_1);
      secp256k1_fe_mul(&x3_1,&x3_1,&local_2d8);
      x6.n[4] = x3_1.n[4];
      x6.n[2] = x3_1.n[2];
      x6.n[3] = x3_1.n[3];
      x6.n[0] = x3_1.n[0];
      x6.n[1] = x3_1.n[1];
      iVar2 = 3;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        secp256k1_fe_sqr(&x6,&x6);
      }
      secp256k1_fe_mul(&x6,&x6,&x3_1);
      x9.n[4] = x6.n[4];
      x9.n[2] = x6.n[2];
      x9.n[3] = x6.n[3];
      x9.n[0] = x6.n[0];
      x9.n[1] = x6.n[1];
      iVar2 = 3;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        secp256k1_fe_sqr(&x9,&x9);
      }
      secp256k1_fe_mul(&x9,&x9,&x3_1);
      x11.n[4] = x9.n[4];
      x11.n[2] = x9.n[2];
      x11.n[3] = x9.n[3];
      x11.n[0] = x9.n[0];
      x11.n[1] = x9.n[1];
      iVar2 = 2;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        secp256k1_fe_sqr(&x11,&x11);
      }
      secp256k1_fe_mul(&x11,&x11,&x2_1);
      x22.n[4] = x11.n[4];
      x22.n[2] = x11.n[2];
      x22.n[3] = x11.n[3];
      x22.n[0] = x11.n[0];
      x22.n[1] = x11.n[1];
      iVar2 = 0xb;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        secp256k1_fe_sqr(&x22,&x22);
      }
      secp256k1_fe_mul(&x22,&x22,&x11);
      x44.n[4] = x22.n[4];
      x44.n[2] = x22.n[2];
      x44.n[3] = x22.n[3];
      x44.n[0] = x22.n[0];
      x44.n[1] = x22.n[1];
      iVar2 = 0x16;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        secp256k1_fe_sqr(&x44,&x44);
      }
      secp256k1_fe_mul(&x44,&x44,&x22);
      x88.n[4] = x44.n[4];
      x88.n[2] = x44.n[2];
      x88.n[3] = x44.n[3];
      x88.n[0] = x44.n[0];
      x88.n[1] = x44.n[1];
      iVar2 = 0x2c;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        secp256k1_fe_sqr(&x88,&x88);
      }
      secp256k1_fe_mul(&x88,&x88,&x44);
      x176.n[4] = x88.n[4];
      x176.n[2] = x88.n[2];
      x176.n[3] = x88.n[3];
      x176.n[0] = x88.n[0];
      x176.n[1] = x88.n[1];
      iVar2 = 0x58;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        secp256k1_fe_sqr(&x176,&x176);
      }
      secp256k1_fe_mul(&x176,&x176,&x88);
      x220.n[4] = x176.n[4];
      x220.n[2] = x176.n[2];
      x220.n[3] = x176.n[3];
      x220.n[0] = x176.n[0];
      x220.n[1] = x176.n[1];
      iVar2 = 0x2c;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        secp256k1_fe_sqr(&x220,&x220);
      }
      secp256k1_fe_mul(&x220,&x220,&x44);
      x223.n[4] = x220.n[4];
      x223.n[2] = x220.n[2];
      x223.n[3] = x220.n[3];
      x223.n[0] = x220.n[0];
      x223.n[1] = x220.n[1];
      iVar2 = 3;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        secp256k1_fe_sqr(&x223,&x223);
      }
      secp256k1_fe_mul(&x223,&x223,&x3_1);
      local_228.n[4] = x223.n[4];
      local_228.n[2] = x223.n[2];
      local_228.n[3] = x223.n[3];
      local_228.n[0] = x223.n[0];
      local_228.n[1] = x223.n[1];
      iVar2 = 0x17;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        secp256k1_fe_sqr(&local_228,&local_228);
      }
      secp256k1_fe_mul(&local_228,&local_228,&x22);
      iVar2 = 6;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        secp256k1_fe_sqr(&local_228,&local_228);
      }
      r = &local_388.y;
      secp256k1_fe_mul(&local_228,&local_228,&x2_1);
      secp256k1_fe_sqr(&local_228,&local_228);
      secp256k1_fe_sqr(r,&local_228);
      secp256k1_fe_sqr(&local_228,r);
      y2.n[0] = (local_2d8.n[0] - local_228.n[0]) + 0x3ffffbfffff0bc;
      y2.n[1] = (local_2d8.n[1] - local_228.n[1]) + 0x3ffffffffffffc;
      y2.n[2] = (local_2d8.n[2] - local_228.n[2]) + 0x3ffffffffffffc;
      y2.n[3] = (local_2d8.n[3] - local_228.n[3]) + 0x3ffffffffffffc;
      y2.n[4] = (local_2d8.n[4] - local_228.n[4]) + 0x3fffffffffffc;
      iVar2 = secp256k1_fe_normalizes_to_zero(&y2);
      if (iVar2 != 0) {
        secp256k1_fe_normalize_var(r);
        if (((bVar1 != 3 ^ (byte)local_388.y.n[0]) & 1) == 0) {
          local_388.y.n[0] = 0x3ffffbfffff0bc - local_388.y.n[0];
          local_388.y.n[1] = 0x3ffffffffffffc - local_388.y.n[1];
          local_388.y.n[2] = 0x3ffffffffffffc - local_388.y.n[2];
          local_388.y.n[3] = 0x3ffffffffffffc - local_388.y.n[3];
          local_388.y.n[4] = 0x3fffffffffffc - local_388.y.n[4];
        }
        iVar3 = 1;
      }
    }
  }
  if (iVar3 != 0) {
    secp256k1_pubkey_save(pubkey,&local_388);
    secp256k1_ge_clear(&local_388);
  }
  return (uint)(iVar3 != 0);
}

Assistant:

int secp256k1_ec_pubkey_parse(const secp256k1_context* ctx, secp256k1_pubkey* pubkey, const unsigned char *input, size_t inputlen) {
    secp256k1_ge Q;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(input != NULL);
    if (!secp256k1_eckey_pubkey_parse(&Q, input, inputlen)) {
        return 0;
    }
    secp256k1_pubkey_save(pubkey, &Q);
    secp256k1_ge_clear(&Q);
    return 1;
}